

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recursive_descent_parser.cpp
# Opt level: O0

JsonValue * __thiscall MercuryJson::JSON::_parse_array(JSON *this)

{
  ulong *puVar1;
  char *pcVar2;
  runtime_error *prVar3;
  JsonArray *pJVar4;
  JsonValue *in_RDI;
  JSON *unaff_retaddr;
  JsonArray *ptr;
  JsonArray *array;
  JsonValue *value;
  char ch;
  size_t idx;
  size_t in_stack_00000198;
  char in_stack_000001a7;
  char *in_stack_000001a8;
  JSON *in_stack_000001b0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  char cVar5;
  JsonArray *local_48;
  JsonValue *local_8;
  
  if (*(char *)(*(long *)in_RDI + **(long **)(in_RDI + 2)) == ']') {
    puVar1 = *(ulong **)(in_RDI + 2);
    *(ulong **)(in_RDI + 2) = puVar1 + 1;
    if ((JsonArray *)(in_RDI->field_1).str <= (JsonArray *)*puVar1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"text ended prematurely");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_8 = BlockAllocator<MercuryJson::JsonValue>::
              construct<MercuryJson::JsonValue,MercuryJson::JsonArray*>
                        ((BlockAllocator<MercuryJson::JsonValue> *)
                         CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                         (JsonArray *)in_RDI);
  }
  else {
    _parse_value(unaff_retaddr);
    local_48 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>
                         ((BlockAllocator<MercuryJson::JsonValue> *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),in_RDI);
    while( true ) {
      puVar1 = *(ulong **)(in_RDI + 2);
      *(ulong **)(in_RDI + 2) = puVar1 + 1;
      pcVar2 = (char *)*puVar1;
      if ((in_RDI->field_1).str <= pcVar2) {
        prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar3,"text ended prematurely");
        __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      cVar5 = pcVar2[*(long *)in_RDI];
      if (cVar5 == ']') break;
      if (cVar5 != ',') {
        _error(in_stack_000001b0,in_stack_000001a8,in_stack_000001a7,in_stack_00000198);
      }
      _parse_value(unaff_retaddr);
      pJVar4 = BlockAllocator<MercuryJson::JsonValue>::
               construct<MercuryJson::JsonArray,MercuryJson::JsonValue*>
                         ((BlockAllocator<MercuryJson::JsonValue> *)
                          CONCAT17(cVar5,in_stack_ffffffffffffffb0),in_RDI);
      local_48->next = pJVar4;
      local_48 = pJVar4;
    }
    local_8 = BlockAllocator<MercuryJson::JsonValue>::
              construct<MercuryJson::JsonValue,MercuryJson::JsonArray*>
                        ((BlockAllocator<MercuryJson::JsonValue> *)
                         CONCAT17(0x5d,in_stack_ffffffffffffffb0),(JsonArray *)in_RDI);
  }
  return local_8;
}

Assistant:

JsonValue *JSON::_parse_array() {
        size_t idx;
        char ch;
        peek_char();
        if (ch == ']') {
            next_char();
            return allocator.construct(static_cast<JsonArray *>(nullptr));
        }
        JsonValue *value = _parse_value();
        auto *array = allocator.construct<JsonArray>(value), *ptr = array;
        while (true) {
            next_char();
            if (ch == ']') break;
            expect(',');
            value = _parse_value();
            ptr = ptr->next = allocator.construct<JsonArray>(value);
        }
        return allocator.construct(array);
    }